

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O2

size_t __thiscall
webrtc::WavReader::ReadSamples(WavReader *this,size_t num_samples,int16_t *samples)

{
  int iVar1;
  string *result;
  ostream *poVar2;
  size_t *v2;
  size_t read;
  FatalMessage local_188;
  
  if (this->num_samples_remaining_ < num_samples) {
    num_samples = this->num_samples_remaining_;
  }
  read = fread(samples,2,num_samples,(FILE *)this->file_handle_);
  if (read != num_samples) {
    iVar1 = feof((FILE *)this->file_handle_);
    if (iVar1 == 0) {
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,0x58);
      poVar2 = std::operator<<((ostream *)&local_188,
                               "Check failed: read == num_samples || feof(file_handle_)");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<(poVar2,"# ");
      rtc::FatalMessage::~FatalMessage(&local_188);
    }
  }
  v2 = &this->num_samples_remaining_;
  result = rtc::CheckLEImpl<unsigned_long,unsigned_long>(&read,v2,"read <= num_samples_remaining_");
  if (result == (string *)0x0) {
    *v2 = *v2 - read;
    return read;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,0x59,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

size_t WavReader::ReadSamples(size_t num_samples, int16_t* samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to big-endian when reading from WAV file"
#endif
  // There could be metadata after the audio; ensure we don't read it.
  num_samples = std::min(num_samples, num_samples_remaining_);
  const size_t read =
      fread(samples, sizeof(*samples), num_samples, file_handle_);
  // If we didn't read what was requested, ensure we've reached the EOF.
  RTC_CHECK(read == num_samples || feof(file_handle_));
  RTC_CHECK_LE(read, num_samples_remaining_);
  num_samples_remaining_ -= read;
  return read;
}